

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackDebGenerator::PackageOnePack
          (cmCPackDebGenerator *this,string *initialTopLevel,string *packageName)

{
  GlobInternals *pGVar1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  undefined8 msg;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  long *plVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_t sVar8;
  GlobInternals *pGVar9;
  size_type *psVar10;
  uint uVar11;
  string findExpr;
  string component_path;
  string outputFileName;
  string packageFileName;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  Glob gl;
  string local_2c0;
  long *local_2a0 [2];
  long local_290 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  long *local_240 [2];
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  undefined1 local_200 [112];
  ios_base local_190 [264];
  undefined1 local_88 [24];
  size_type sStack_70;
  bool local_37;
  
  local_240[0] = local_230;
  pcVar2 = (initialTopLevel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar2,pcVar2 + initialTopLevel->_M_string_length);
  cmsys::SystemTools::GetParentDirectory(&local_260,&(this->super_cmCPackGenerator).toplevel);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"CPACK_PACKAGE_FILE_NAME","")
  ;
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2c0);
  std::__cxx11::string::string((string *)local_2a0,pcVar6,(allocator *)local_220);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_2a0);
  pGVar1 = (GlobInternals *)(local_88 + 0x10);
  pGVar9 = (GlobInternals *)(plVar7 + 2);
  if ((GlobInternals *)*plVar7 == pGVar9) {
    local_88._16_8_ =
         (pGVar9->Files).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    sStack_70 = plVar7[3];
    local_88._0_8_ = pGVar1;
  }
  else {
    local_88._16_8_ =
         (pGVar9->Files).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_88._0_8_ = (GlobInternals *)*plVar7;
  }
  local_88._8_8_ = plVar7[1];
  *plVar7 = (long)pGVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append(local_88,(ulong)(packageName->_M_dataplus)._M_p);
  pcVar2 = local_200 + 0x10;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_200._16_8_ = *psVar10;
    local_200._24_4_ = (undefined4)plVar7[3];
    local_200._28_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_200._0_8_ = pcVar2;
  }
  else {
    local_200._16_8_ = *psVar10;
    local_200._0_8_ = (size_type *)*plVar7;
  }
  local_200._8_8_ = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  plVar7 = (long *)std::__cxx11::string::append(local_200);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_280.field_2._M_allocated_capacity = *psVar10;
    local_280.field_2._8_8_ = plVar7[3];
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar10;
    local_280._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_280._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  if ((GlobInternals *)local_88._0_8_ != pGVar1) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,"/",
                 packageName);
  std::__cxx11::string::_M_append((char *)local_240,local_200._0_8_);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_200,(char *)local_240[0]);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,"/",
                 &local_280);
  std::__cxx11::string::_M_append((char *)&local_260,local_200._0_8_);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_200,local_280._M_dataplus._M_p);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_200,local_260._M_dataplus._M_p);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CPACK_DEB_PACKAGE_COMPONENT","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_200,(packageName->_M_dataplus)._M_p);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"/","");
  std::__cxx11::string::_M_append((char *)local_2a0,(ulong)(packageName->_M_dataplus)._M_p);
  local_200._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_200,(char *)local_2a0[0]);
  if ((pointer)local_200._0_8_ != pcVar2) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  bVar4 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackDeb.cmake");
  if (bVar4) {
    cmsys::Glob::Glob((Glob *)local_88);
    local_200._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"GEN_WDIR","");
    pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_200);
    std::__cxx11::string::string((string *)&local_2c0,pcVar6,(allocator *)local_220);
    if ((pointer)local_200._0_8_ != pcVar2) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    std::__cxx11::string::append((char *)&local_2c0);
    local_88[8] = 1;
    local_37 = true;
    bVar4 = cmsys::Glob::FindFiles((Glob *)local_88,&local_2c0,(GlobMessages *)0x0);
    if (bVar4) {
      __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,__x);
      iVar5 = createDeb(this);
      local_200._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"CPACK_TOPLEVEL_DIRECTORY","");
      pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_200);
      strlen(pcVar6);
      std::__cxx11::string::_M_replace
                ((ulong)&local_260,0,(char *)local_260._M_string_length,(ulong)pcVar6);
      if ((pointer)local_200._0_8_ != pcVar2) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      std::__cxx11::string::append((char *)&local_260);
      local_200._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,"GEN_CPACK_OUTPUT_FILE_NAME","");
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_200);
      std::__cxx11::string::append((char *)&local_260);
      if ((pointer)local_200._0_8_ != pcVar2) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&local_260);
      uVar11 = (uint)(iVar5 == 1);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"Cannot find any files in the installed directory",0x30);
      std::ios::widen((char)*(undefined8 *)(local_200._0_8_ + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar7 = local_220[0];
      sVar8 = strlen((char *)local_220[0]);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x5b,(char *)plVar7,sVar8);
      if (local_220[0] != local_210) {
        operator_delete(local_220[0],local_210[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      std::ios_base::~ios_base(local_190);
      uVar11 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    cmsys::Glob::~Glob((Glob *)local_88);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,"Error while execution CPackDeb.cmake",0x24);
    std::ios::widen((char)*(undefined8 *)(local_200._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg = local_88._0_8_;
    sVar8 = strlen((char *)local_88._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x4e,(char *)msg,sVar8);
    if ((GlobInternals *)local_88._0_8_ != pGVar1) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    uVar11 = 0;
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  return uVar11;
}

Assistant:

int cmCPackDebGenerator::PackageOnePack(std::string const& initialTopLevel,
                                        std::string const& packageName)
{
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(cmSystemTools::GetParentDirectory(toplevel));
  std::string outputFileName(
    std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME")) + "-" +
    packageName + this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel.c_str());
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());
  // Tell CPackDeb.cmake the name of the component GROUP.
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT", packageName.c_str());
  // Tell CPackDeb.cmake the path where the component is.
  std::string component_path = "/";
  component_path += packageName;
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",
                  component_path.c_str());
  if (!this->ReadListFile("CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Error while execution CPackDeb.cmake"
                    << std::endl);
    retval = 0;
    return retval;
  }

  cmsys::Glob gl;
  std::string findExpr(this->GetOption("GEN_WDIR"));
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the installed directory"
                    << std::endl);
    return 0;
  }
  packageFiles = gl.GetFiles();

  int res = createDeb();
  if (res != 1) {
    retval = 0;
  }
  // add the generated package to package file names list
  packageFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  packageFileName += "/";
  packageFileName += this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME");
  packageFileNames.push_back(packageFileName);
  return retval;
}